

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O1

vector<duckdb::LogicalType,_true> *
duckdb::TableFunctionExtractor::GetParameterLogicalTypes
          (vector<duckdb::LogicalType,_true> *__return_storage_ptr__,
          TableFunctionCatalogEntry *entry,idx_t offset)

{
  TableFunction fun;
  TableFunction local_1c0;
  
  FunctionSet<duckdb::TableFunction>::GetFunctionByOffset
            (&local_1c0,&(entry->functions).super_FunctionSet<duckdb::TableFunction>,offset);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&__return_storage_ptr__->
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &local_1c0.super_SimpleNamedParameterFunction.super_SimpleFunction.arguments.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  local_1c0.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__TableFunction_01993668;
  if (local_1c0.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c0.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_1c0.super_SimpleNamedParameterFunction);
  return __return_storage_ptr__;
}

Assistant:

static vector<LogicalType> GetParameterLogicalTypes(TableFunctionCatalogEntry &entry, idx_t offset) {
		auto fun = entry.functions.GetFunctionByOffset(offset);
		return fun.arguments;
	}